

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O1

void __thiscall indk::Interlink::doUpdateStructure(Interlink *this,string *data)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"io_app_update_structure","");
  doSend(this,&local_40,data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void indk::Interlink::doUpdateStructure(const std::string &data) {
    doSend("io_app_update_structure", data);
}